

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.cpp
# Opt level: O0

void __thiscall Args_ErrorMissingValueEqual_Test::TestBody(Args_ErrorMissingValueEqual_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_00000030;
  int *in_stack_00000038;
  string *in_stack_00000040;
  char ***in_stack_00000048;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  char **argv;
  int nthreads;
  anon_class_8_1_dd4303e2 callback;
  bool errCalled;
  undefined1 in_stack_fffffffffffffe5f;
  AssertionResult *in_stack_fffffffffffffe60;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  int iVar6;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  Type type;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char *in_stack_fffffffffffffe98;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string local_150 [16];
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_f8;
  string local_e8 [40];
  string *in_stack_ffffffffffffff40;
  undefined1 local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  AssertionResult local_70 [2];
  allocator<char> local_49;
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined1 local_9 [9];
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_9[0] = 0;
  local_18 = local_9;
  local_1c = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            makeArgs(in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  __s = &local_91;
  local_28 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__s,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  type = (Type)((ulong)local_b8 >> 0x20);
  std::function<void(std::__cxx11::string)>::
  function<Args_ErrorMissingValueEqual_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffe70,
             (anon_class_8_1_dd4303e2 *)
             CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  uVar1 = pbrt::ParseArg<int*>
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58e831);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffe90));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffe90),type,
               (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80))
               ,iVar6,(char *)in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_e8);
    testing::Message::~Message((Message *)0x58e9d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58ea49);
  pAVar5 = &local_f8;
  testing::internal::EqHelper<false>::Compare<int,int>
            (&pAVar5->success_,(char *)in_stack_fffffffffffffe70,
             (int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (int *)in_stack_fffffffffffffe60);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  iVar6 = (int)((ulong)pAVar5 >> 0x20);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffe90));
    in_stack_fffffffffffffe70 =
         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x58eaea);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffe90),type,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffe80)),iVar6,
               (char *)in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x58eb47);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58eb9c);
  pAVar5 = (AssertionResult *)&stack0xfffffffffffffee0;
  testing::AssertionResult::AssertionResult(pAVar5,(bool)in_stack_fffffffffffffe5f);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffe90));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffe90),type,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffe80)),iVar6,
               (char *)in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar5);
    std::__cxx11::string::~string(local_150);
    testing::Message::~Message((Message *)0x58ec9a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58ed0c);
  return;
}

Assistant:

TEST(Args, ErrorMissingValueEqual) {
    bool errCalled = false;
    auto callback = [&errCalled](const std::string &s) { errCalled = true; };

    int nthreads = 2;
    auto argv = makeArgs("--nthreads=");
    EXPECT_FALSE(ParseArg(&argv, "nthreads", &nthreads, callback));
    EXPECT_EQ(nthreads, 2);
    EXPECT_TRUE(errCalled);
}